

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_container.cc
# Opt level: O0

int main(void)

{
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> i2;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> i2_00;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> i2_01;
  bool bVar1;
  result_type_conflict rVar2;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var3;
  iterator __last;
  iterator __g;
  vector<long,_std::allocator<long>_> w;
  long *val;
  iterator __end1;
  iterator __begin1;
  vector<long,_std::allocator<long>_> *__range1;
  vector<long,_std::allocator<long>_> v;
  uniform_int_dist U;
  yarn2 R;
  result_type_conflict in_stack_fffffffffffffe58;
  result_type_conflict in_stack_fffffffffffffe5c;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> in_stack_fffffffffffffe60;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> in_stack_fffffffffffffe68;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> in_stack_fffffffffffffe70;
  vector<long,_std::allocator<long>_> *this;
  size_type in_stack_fffffffffffffe78;
  vector<long,_std::allocator<long>_> *in_stack_fffffffffffffe80;
  vector<long,_std::allocator<long>_> local_a8;
  long *local_90;
  long *local_88;
  reference local_80;
  long *local_78;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_70;
  undefined1 *local_68;
  undefined1 local_48 [40];
  undefined8 local_20;
  int local_4;
  
  local_4 = 0;
  local_20 = trng::yarn2::LEcuyer1;
  trng::yarn2::yarn2((yarn2 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                     (parameter_type)in_stack_fffffffffffffe60._M_current);
  trng::uniform_int_dist::uniform_int_dist
            ((uniform_int_dist *)in_stack_fffffffffffffe60._M_current,in_stack_fffffffffffffe5c,
             in_stack_fffffffffffffe58);
  std::allocator<long>::allocator((allocator<long> *)0x10131f);
  std::vector<long,_std::allocator<long>_>::vector
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (allocator_type *)in_stack_fffffffffffffe70._M_current);
  std::allocator<long>::~allocator((allocator<long> *)0x101345);
  std::operator<<((ostream *)&std::cout,"random number generation by call operator\n");
  local_68 = local_48;
  local_70._M_current =
       (long *)std::vector<long,_std::allocator<long>_>::begin
                         ((vector<long,_std::allocator<long>_> *)
                          CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  local_78 = (long *)std::vector<long,_std::allocator<long>_>::end
                               ((vector<long,_std::allocator<long>_> *)
                                CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                       in_stack_fffffffffffffe60._M_current,
                       (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> *)
                       CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
    if (!bVar1) break;
    local_80 = __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::
               operator*(&local_70);
    rVar2 = trng::uniform_int_dist::operator()
                      ((uniform_int_dist *)in_stack_fffffffffffffe70._M_current,
                       (yarn2 *)in_stack_fffffffffffffe68._M_current);
    *local_80 = (long)rVar2;
    __gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>::operator++
              (&local_70);
  }
  local_88 = (long *)std::vector<long,_std::allocator<long>_>::begin
                               ((vector<long,_std::allocator<long>_> *)
                                CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  local_90 = (long *)std::vector<long,_std::allocator<long>_>::end
                               ((vector<long,_std::allocator<long>_> *)
                                CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  _Var3._M_current._4_4_ = in_stack_fffffffffffffe5c;
  _Var3._M_current._0_4_ = in_stack_fffffffffffffe58;
  print_range<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
            (in_stack_fffffffffffffe60,_Var3);
  std::allocator<long>::allocator((allocator<long> *)0x101497);
  std::vector<long,_std::allocator<long>_>::vector
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
             (allocator_type *)in_stack_fffffffffffffe70._M_current);
  std::allocator<long>::~allocator((allocator<long> *)0x1014bd);
  std::operator<<((ostream *)&std::cout,"random number generation by std::generate\n");
  std::vector<long,_std::allocator<long>_>::begin
            ((vector<long,_std::allocator<long>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  std::vector<long,_std::allocator<long>_>::end
            ((vector<long,_std::allocator<long>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  _Var3._M_current =
       (long *)std::ref<trng::yarn2>
                         ((yarn2 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  std::bind<trng::uniform_int_dist&,std::reference_wrapper<trng::yarn2>>
            ((uniform_int_dist *)in_stack_fffffffffffffe68._M_current,
             (reference_wrapper<trng::yarn2> *)in_stack_fffffffffffffe60._M_current);
  std::
  generate<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::_Bind<trng::uniform_int_dist(std::reference_wrapper<trng::yarn2>)>>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
             (_Bind<trng::uniform_int_dist_(std::reference_wrapper<trng::yarn2>)> *)
             in_stack_fffffffffffffe60._M_current);
  __last = std::vector<long,_std::allocator<long>_>::begin
                     ((vector<long,_std::allocator<long>_> *)
                      CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  __g = std::vector<long,_std::allocator<long>_>::end
                  ((vector<long,_std::allocator<long>_> *)
                   CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  i2._M_current._4_4_ = in_stack_fffffffffffffe5c;
  i2._M_current._0_4_ = in_stack_fffffffffffffe58;
  print_range<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
            (in_stack_fffffffffffffe60,i2);
  std::operator<<((ostream *)&std::cout,"random number generation by std::generate\n");
  std::vector<long,_std::allocator<long>_>::begin
            ((vector<long,_std::allocator<long>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  std::vector<long,_std::allocator<long>_>::end
            ((vector<long,_std::allocator<long>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  std::ref<trng::yarn2>((yarn2 *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  std::bind<trng::uniform_int_dist&,std::reference_wrapper<trng::yarn2>>
            ((uniform_int_dist *)in_stack_fffffffffffffe68._M_current,
             (reference_wrapper<trng::yarn2> *)in_stack_fffffffffffffe60._M_current);
  std::
  generate<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::_Bind<trng::uniform_int_dist(std::reference_wrapper<trng::yarn2>)>>
            (in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
             (_Bind<trng::uniform_int_dist_(std::reference_wrapper<trng::yarn2>)> *)
             in_stack_fffffffffffffe60._M_current);
  this = &local_a8;
  std::vector<long,_std::allocator<long>_>::begin
            ((vector<long,_std::allocator<long>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  std::vector<long,_std::allocator<long>_>::end
            ((vector<long,_std::allocator<long>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  i2_00._M_current._4_4_ = in_stack_fffffffffffffe5c;
  i2_00._M_current._0_4_ = in_stack_fffffffffffffe58;
  print_range<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
            (in_stack_fffffffffffffe60,i2_00);
  std::operator<<((ostream *)&std::cout,"same sequence as above, but in a random shuffled order\n");
  std::vector<long,_std::allocator<long>_>::begin
            ((vector<long,_std::allocator<long>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  std::vector<long,_std::allocator<long>_>::end
            ((vector<long,_std::allocator<long>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  std::
  shuffle<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,trng::yarn2&>
            (_Var3,(__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                   __last._M_current,(yarn2 *)__g._M_current);
  _Var3._M_current = (long *)&local_a8;
  std::vector<long,_std::allocator<long>_>::begin
            ((vector<long,_std::allocator<long>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  std::vector<long,_std::allocator<long>_>::end
            ((vector<long,_std::allocator<long>_> *)
             CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58));
  i2_01._M_current._4_4_ = in_stack_fffffffffffffe5c;
  i2_01._M_current._0_4_ = in_stack_fffffffffffffe58;
  print_range<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
            (_Var3,i2_01);
  local_4 = 0;
  std::vector<long,_std::allocator<long>_>::~vector(this);
  std::vector<long,_std::allocator<long>_>::~vector(this);
  return local_4;
}

Assistant:

int main() {
  trng::yarn2 R;
  trng::uniform_int_dist U(0, 100);
  std::vector<long> v(10);

  std::cout << "random number generation by call operator\n";
  for (auto &val : v)
    val = U(R);
  print_range(v.begin(), v.end());
  std::vector<long> w(12);
  std::cout << "random number generation by std::generate\n";
  std::generate(w.begin(), w.end(), std::bind(U, std::ref(R)));
  print_range(w.begin(), w.end());
  std::cout << "random number generation by std::generate\n";
  std::generate(w.begin(), w.end(), std::bind(U, std::ref(R)));
  print_range(w.begin(), w.end());
  std::cout << "same sequence as above, but in a random shuffled order\n";
  std::shuffle(w.begin(), w.end(), R);
  print_range(w.begin(), w.end());
  return EXIT_SUCCESS;
}